

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

int unzLocateFile(unzFile file,char *szFileName,int iCaseSensitivity)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  char local_1e8 [8];
  char szCurrentFileName [257];
  ZPOS64_T pos_in_central_dirSaved;
  ZPOS64_T num_fileSaved;
  unz_file_info64_internal cur_file_info_internalSaved;
  unz_file_info64 cur_file_infoSaved;
  int err;
  unz64_s *s;
  int iCaseSensitivity_local;
  char *szFileName_local;
  unzFile file_local;
  
  if (file == (unzFile)0x0) {
    file_local._4_4_ = 0xffffff9a;
  }
  else {
    sVar5 = strlen(szFileName);
    if (sVar5 < 0x100) {
      if (*(long *)((long)file + 0x90) == 0) {
        file_local._4_4_ = 0xffffff9c;
      }
      else {
        uVar1 = *(undefined8 *)((long)file + 0x80);
        uVar2 = *(undefined8 *)((long)file + 0x88);
        memcpy(&cur_file_info_internalSaved,(void *)((long)file + 0xb0),0x88);
        uVar3 = *(undefined8 *)((long)file + 0x138);
        cur_file_infoSaved.tmu_date.tm_year = unzGoToFirstFile(file);
        while (cur_file_infoSaved.tmu_date.tm_year == 0) {
          cur_file_infoSaved.tmu_date.tm_year =
               unzGetCurrentFileInfo64
                         (file,(unz_file_info64 *)0x0,local_1e8,0x100,(void *)0x0,0,(char *)0x0,0);
          if (cur_file_infoSaved.tmu_date.tm_year == 0) {
            iVar4 = unzStringFileNameCompare(local_1e8,szFileName,iCaseSensitivity);
            if (iVar4 == 0) {
              return 0;
            }
            cur_file_infoSaved.tmu_date.tm_year = unzGoToNextFile(file);
          }
        }
        *(undefined8 *)((long)file + 0x80) = uVar1;
        *(undefined8 *)((long)file + 0x88) = uVar2;
        memcpy((void *)((long)file + 0xb0),&cur_file_info_internalSaved,0x88);
        *(undefined8 *)((long)file + 0x138) = uVar3;
        file_local._4_4_ = cur_file_infoSaved.tmu_date.tm_year;
      }
    }
    else {
      file_local._4_4_ = 0xffffff9a;
    }
  }
  return file_local._4_4_;
}

Assistant:

extern int ZEXPORT unzLocateFile(unzFile file, const char* szFileName, int iCaseSensitivity)
{
    unz64_s* s;
    int err;

    /* We remember the 'current' position in the file so that we can jump
     * back there if we fail.
     */
    unz_file_info64 cur_file_infoSaved;
    unz_file_info64_internal cur_file_info_internalSaved;
    ZPOS64_T num_fileSaved;
    ZPOS64_T pos_in_central_dirSaved;


    if (file == NULL)
        return UNZ_PARAMERROR;

    if (strlen(szFileName) >= UNZ_MAXFILENAMEINZIP)
        return UNZ_PARAMERROR;

    s = (unz64_s*)file;
    if (!s->current_file_ok)
        return UNZ_END_OF_LIST_OF_FILE;

    /* Save the current state */
    num_fileSaved = s->num_file;
    pos_in_central_dirSaved = s->pos_in_central_dir;
    cur_file_infoSaved = s->cur_file_info;
    cur_file_info_internalSaved = s->cur_file_info_internal;

    err = unzGoToFirstFile(file);

    while (err == UNZ_OK)
    {
        char szCurrentFileName[UNZ_MAXFILENAMEINZIP + 1];
        err = unzGetCurrentFileInfo64(file, NULL,
            szCurrentFileName, sizeof(szCurrentFileName) - 1,
            NULL, 0, NULL, 0);
        if (err == UNZ_OK)
        {
            if (unzStringFileNameCompare(szCurrentFileName,
                szFileName, iCaseSensitivity) == 0)
                return UNZ_OK;
            err = unzGoToNextFile(file);
        }
    }

    /* We failed, so restore the state of the 'current file' to where we
     * were.
     */
    s->num_file = num_fileSaved;
    s->pos_in_central_dir = pos_in_central_dirSaved;
    s->cur_file_info = cur_file_infoSaved;
    s->cur_file_info_internal = cur_file_info_internalSaved;
    return err;
}